

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
spirv_cross::Compiler::type_struct_member_array_stride(Compiler *this,SPIRType *type,uint32_t index)

{
  Meta *pMVar1;
  CompilerError *pCVar2;
  allocator local_39;
  string local_38;
  
  pMVar1 = ParsedIR::find_meta(&this->ir,
                               (ID)(type->member_types).
                                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>.
                                   ptr[index].id);
  if (pMVar1 == (Meta *)0x0) {
    pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Struct member does not have ArrayStride set.",&local_39);
    CompilerError::CompilerError(pCVar2,&local_38);
    __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (((pMVar1->decoration).decoration_flags.lower & 0x40) != 0) {
    return (pMVar1->decoration).array_stride;
  }
  pCVar2 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Struct member does not have ArrayStride set.",&local_39);
  CompilerError::CompilerError(pCVar2,&local_38);
  __cxa_throw(pCVar2,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

uint32_t Compiler::type_struct_member_array_stride(const SPIRType &type, uint32_t index) const
{
	auto *type_meta = ir.find_meta(type.member_types[index]);
	if (type_meta)
	{
		// Decoration must be set in valid SPIR-V, otherwise throw.
		// ArrayStride is part of the array type not OpMemberDecorate.
		auto &dec = type_meta->decoration;
		if (dec.decoration_flags.get(DecorationArrayStride))
			return dec.array_stride;
		else
			SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
	}
	else
		SPIRV_CROSS_THROW("Struct member does not have ArrayStride set.");
}